

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PsxRelocator.cpp
# Opt level: O2

size_t __thiscall
PsxRelocator::loadString(PsxRelocator *this,ByteArray *data,size_t pos,string *dest)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  
  dest->_M_string_length = 0;
  *(dest->_M_dataplus)._M_p = '\0';
  bVar1 = data->data_[pos];
  uVar3 = (ulong)bVar1;
  while (iVar2 = (int)uVar3, uVar3 = (ulong)(iVar2 - 1), iVar2 != 0) {
    std::__cxx11::string::push_back((char)dest);
  }
  return (ulong)bVar1 + 1;
}

Assistant:

size_t PsxRelocator::loadString(ByteArray& data, size_t pos, std::string& dest)
{
	dest.clear();
	int len = data[pos++];

	for (int i = 0; i < len; i++)
	{
		dest += data[pos++];
	}

	return len+1;
}